

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_log.cpp
# Opt level: O1

void duckdb::DuckDBLogFun::RegisterFunction(BuiltinFunctions *set)

{
  __alloc_node_gen_t __alloc_node_gen;
  TableFunction logs_fun;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  string local_3b8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_398;
  undefined1 local_390 [144];
  __buckets_ptr local_300;
  size_type local_2f8;
  __node_base local_2f0;
  size_type local_2e8;
  _Prime_rehash_policy local_2e0;
  __node_base_ptr local_2d0;
  undefined1 auStack_2c8 [216];
  element_type *local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  TableFunctionInitialization local_1e0;
  TableFunction local_1d8;
  
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"duckdb_logs","");
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1d8,&local_3b8,(vector<duckdb::LogicalType,_true> *)&local_3d8,DuckDBLogFunction
             ,DuckDBLogBind,DuckDBLogInit,(table_function_init_local_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  SimpleFunction::SimpleFunction((SimpleFunction *)local_390,(SimpleFunction *)&local_1d8);
  local_390._0_8_ = &PTR__SimpleNamedParameterFunction_01999638;
  local_398._M_h = (__hashtable_alloc *)&local_300;
  local_300 = (__buckets_ptr)0x0;
  local_2f8 = local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_bucket_count;
  local_2f0._M_nxt = (_Hash_node_base *)0x0;
  local_2e8 = local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_element_count;
  local_2e0._M_max_load_factor =
       local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_2e0._4_4_ =
       local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy._4_4_;
  local_2e0._M_next_resize =
       local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_2d0 = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_398._M_h,&local_1d8.super_SimpleNamedParameterFunction.named_parameters._M_h,
             &local_398);
  local_390._0_8_ = &PTR__TableFunction_01999508;
  switchD_00b1522a::default(auStack_2c8,&local_1d8.bind,0xd6);
  local_1f0 = local_1d8.function_info.internal.
              super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1e8._M_pi =
       local_1d8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_1d8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1d8.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d8.function_info.internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_1d8.function_info.internal.
            super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_1e0 = local_1d8.global_initialization;
  BuiltinFunctions::AddFunction(set,(TableFunction *)local_390);
  local_390._0_8_ = &PTR__TableFunction_01999508;
  if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_390);
  local_1d8.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01999508;
  if (local_1d8.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d8.super_SimpleNamedParameterFunction);
  return;
}

Assistant:

void DuckDBLogFun::RegisterFunction(BuiltinFunctions &set) {
	TableFunction logs_fun("duckdb_logs", {}, DuckDBLogFunction, DuckDBLogBind, DuckDBLogInit);
	set.AddFunction(logs_fun);
}